

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupOutputVec(Gia_Man_t *p,Vec_Int_t *vOutPres)

{
  uint uVar1;
  int iVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                  ,0x10c,"Gia_Man_t *Gia_ManDupOutputVec(Gia_Man_t *, Vec_Int_t *)");
  }
  if (p->vCos->nSize == vOutPres->nSize) {
    Gia_ManFillValue(p);
    p_00 = Gia_ManStart(p->nObjs);
    pcVar3 = Abc_UtilStrsav(p->pName);
    p_00->pName = pcVar3;
    pcVar3 = Abc_UtilStrsav(p->pSpec);
    p_00->pSpec = pcVar3;
    p->pObjs->Value = 0;
    iVar5 = 0;
    while ((iVar5 < p->vCis->nSize - p->nRegs &&
           (pGVar4 = Gia_ManCi(p,iVar5), pGVar4 != (Gia_Obj_t *)0x0))) {
      uVar1 = Gia_ManAppendCi(p_00);
      pGVar4->Value = uVar1;
      iVar5 = iVar5 + 1;
    }
    iVar5 = 0;
    while ((iVar5 < p->vCos->nSize - p->nRegs &&
           (pGVar4 = Gia_ManCo(p,iVar5), pGVar4 != (Gia_Obj_t *)0x0))) {
      iVar2 = Vec_IntEntry(vOutPres,iVar5);
      if (iVar2 != 0) {
        Gia_ManDupOrderDfs_rec(p_00,p,pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff));
      }
      iVar5 = iVar5 + 1;
    }
    iVar5 = 0;
    while( true ) {
      if (p->vCos->nSize - p->nRegs <= iVar5) {
        return p_00;
      }
      pGVar4 = Gia_ManCo(p,iVar5);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      iVar2 = Vec_IntEntry(vOutPres,iVar5);
      if (iVar2 != 0) {
        iVar2 = Gia_ObjFanin0Copy(pGVar4);
        uVar1 = Gia_ManAppendCo(p_00,iVar2);
        pGVar4->Value = uVar1;
      }
      iVar5 = iVar5 + 1;
    }
    return p_00;
  }
  __assert_fail("Gia_ManPoNum(p) == Vec_IntSize(vOutPres)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                ,0x10d,"Gia_Man_t *Gia_ManDupOutputVec(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupOutputVec( Gia_Man_t * p, Vec_Int_t * vOutPres )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManPoNum(p) == Vec_IntSize(vOutPres) );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachPo( p, pObj, i )
        if ( Vec_IntEntry(vOutPres, i) )
            Gia_ManDupOrderDfs_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        if ( Vec_IntEntry(vOutPres, i) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    return pNew;
}